

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMULSM9DS0.cpp
# Opt level: O0

bool __thiscall RTIMULSM9DS0::setAccelCTRL1(RTIMULSM9DS0 *this)

{
  uchar ctrl1;
  RTIMULSM9DS0 *this_local;
  
  if ((((this->super_RTIMU).m_settings)->m_LSM9DS0AccelSampleRate < 0) ||
     (10 < ((this->super_RTIMU).m_settings)->m_LSM9DS0AccelSampleRate)) {
    fprintf(_stderr,"Illegal LSM9DS0 accel sample rate code %d\n",
            (ulong)(uint)((this->super_RTIMU).m_settings)->m_LSM9DS0AccelSampleRate);
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ =
         RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                            this->m_accelCompassSlaveAddr,' ',
                            (byte)(((this->super_RTIMU).m_settings)->m_LSM9DS0AccelSampleRate << 4)
                            | 7,"Failed to set LSM9DS0 accell CTRL1");
  }
  return this_local._7_1_;
}

Assistant:

bool RTIMULSM9DS0::setAccelCTRL1()
{
    unsigned char ctrl1;

    if ((m_settings->m_LSM9DS0AccelSampleRate < 0) || (m_settings->m_LSM9DS0AccelSampleRate > 10)) {
        HAL_ERROR1("Illegal LSM9DS0 accel sample rate code %d\n", m_settings->m_LSM9DS0AccelSampleRate);
        return false;
    }

    ctrl1 = (m_settings->m_LSM9DS0AccelSampleRate << 4) | 0x07;

    return m_settings->HALWrite(m_accelCompassSlaveAddr,  LSM9DS0_CTRL1, ctrl1, "Failed to set LSM9DS0 accell CTRL1");
}